

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,UInt32 code_point)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  string local_58;
  undefined1 local_38 [8];
  char str [5];
  
  uVar3 = (uint)this;
  if (0x1fffff < uVar3) {
    String::FormatHexInt_abi_cxx11_(&local_58,(String *)this,code_point);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "(Invalid Unicode 0x",&local_58);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,")"
                  );
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)&local_58);
    return __return_storage_ptr__;
  }
  if (uVar3 < 0x80) {
    local_38[1] = 0;
  }
  else {
    if (uVar3 < 0x800) {
      local_38[2] = 0;
      local_38[0] = (string)((byte)((ulong)this >> 6) | 0xc0);
      local_38[1] = (byte)this & 0x3f | 0x80;
      goto LAB_0011584e;
    }
    bVar2 = (byte)this & 0x3f | 0x80;
    bVar1 = (byte)((ulong)this >> 0xc);
    local_38[2] = (byte)((ulong)this >> 6) & 0x3f | 0x80;
    if (uVar3 < 0x10000) {
      local_38[3] = 0;
      local_38[0] = (string)(bVar1 | 0xe0);
      local_38[1] = local_38[2];
      local_38[2] = bVar2;
      goto LAB_0011584e;
    }
    local_38[4] = 0;
    local_38[1] = bVar1 & 0x3f | 0x80;
    this = (internal *)(ulong)(byte)((byte)(uVar3 >> 0x12) | 0xf0);
    local_38[3] = bVar2;
  }
  local_38[0] = SUB81(this,0);
LAB_0011584e:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38,(allocator<char> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(UInt32 code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexInt(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}